

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O3

void value_suite::test_float_as_real(void)

{
  char *pcVar1;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  type_conflict8 tVar2;
  type_conflict9 tVar3;
  variable data;
  unkbyte10 local_58;
  undefined1 local_48 [8];
  ushort uStack_40;
  type local_38;
  undefined1 local_18;
  
  local_18 = 0xc;
  local_38._0_4_ = 0;
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  _local_48 = (longdouble)((unkuint10)stack0xffffffffffffffbc << 0x20);
  local_58._0_4_ = tVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","0.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1600,"void value_suite::test_float_as_real()",&local_58,local_48);
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT64(local_58._4_6_,tVar2);
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  _local_48 = (longdouble)CONCAT64(stack0xffffffffffffffbc,tVar2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","float(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1601,"void value_suite::test_float_as_real()",&local_58,local_48);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  _local_48 = (longdouble)((unkuint10)uStack_40 << 0x40);
  local_58._0_8_ = tVar3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1602,"void value_suite::test_float_as_real()",&local_58,local_48);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT28(local_58._8_2_,tVar3);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  _local_48 = (longdouble)CONCAT28(uStack_40,tVar3);
  pcVar1 = "double(data)";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","double(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1603,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&local_38.__align,(basic_variable<std::allocator<char>_> *)pcVar1);
  _local_48 = (longdouble)0;
  pcVar1 = "0.0L";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","0.0L",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1604,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&local_38.__align,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_58 = in_ST1;
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&local_38.__align,(basic_variable<std::allocator<char>_> *)pcVar1);
  _local_48 = (longdouble)in_ST2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","(long double)(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1605,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  local_38._0_4_ = 0x800000;
  local_18 = 0xc;
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT64(local_58._4_6_,tVar2);
  local_48._0_4_ = 0x800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1608,"void value_suite::test_float_as_real()",&local_58,local_48);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT28(local_58._8_2_,tVar3);
  local_48._0_4_ = 0x800000;
  pcVar1 = "std::numeric_limits<float>::min()";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,float>
            ("data.value<double>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1609,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&local_38.__align,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_48._0_4_ = 0x800000;
  local_58 = in_ST3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,float>
            ("data.value<long double>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160a,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  local_38._0_4_ = 0x7f7fffff;
  local_18 = 0xc;
  tVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT64(local_58._4_6_,tVar2);
  local_48._0_4_ = 0x7f7fffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160d,"void value_suite::test_float_as_real()",&local_58,local_48);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                    ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_58 = CONCAT28(local_58._8_2_,tVar3);
  local_48._0_4_ = 0x7f7fffff;
  pcVar1 = "std::numeric_limits<float>::max()";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,float>
            ("data.value<double>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160e,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)&local_38.__align,(basic_variable<std::allocator<char>_> *)pcVar1);
  _local_48 = (longdouble)CONCAT64(stack0xffffffffffffffbc,0x7f7fffff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,float>
            ("data.value<long double>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160f,"void value_suite::test_float_as_real()",&local_58,local_48);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_38.__align);
  return;
}

Assistant:

void test_float_as_real()
{
    variable data(0.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 0.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), float(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 0.0);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), double(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), 0.0L);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), (long double)(data));

    data = std::numeric_limits<float>::min();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), std::numeric_limits<float>::min());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), std::numeric_limits<float>::min());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<float>::min());

    data = std::numeric_limits<float>::max();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), std::numeric_limits<float>::max());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), std::numeric_limits<float>::max());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<float>::max());
}